

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::anon_unknown_0::DumpSignalInfo(int signal_number,siginfo_t *siginfo)

{
  undefined *puVar1;
  __pid_t _Var2;
  int iVar3;
  pthread_t number;
  undefined1 local_140 [8];
  MinimalFormatter formatter;
  char buf [256];
  size_t i;
  char *signal_name;
  siginfo_t *siginfo_local;
  int signal_number_local;
  
  i = 0;
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  for (; (ulong)buf._248_8_ < 6; buf._248_8_ = buf._248_8_ + 1) {
    if (signal_number == *(int *)((anonymous_namespace)::kFailureSignals + buf._248_8_ * 0x10)) {
      i = *(size_t *)((anonymous_namespace)::kFailureSignals + buf._248_8_ * 0x10 + 8);
    }
  }
  MinimalFormatter::MinimalFormatter((MinimalFormatter *)local_140,(char *)&formatter.end_,0x100);
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,"*** ");
  if (i == 0) {
    MinimalFormatter::AppendString((MinimalFormatter *)local_140,"Signal ");
    MinimalFormatter::AppendUint64((MinimalFormatter *)local_140,(long)signal_number,10);
  }
  else {
    MinimalFormatter::AppendString((MinimalFormatter *)local_140,(char *)i);
  }
  MinimalFormatter::AppendString((MinimalFormatter *)local_140," (@0x");
  MinimalFormatter::AppendUint64
            ((MinimalFormatter *)local_140,(siginfo->_sifields)._sigpoll.si_band,0x10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,")");
  MinimalFormatter::AppendString((MinimalFormatter *)local_140," received by PID ");
  _Var2 = getpid();
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_140,(long)_Var2,10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_140," (TID 0x");
  number = pthread_self();
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_140,number,0x10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,") ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,"from PID ");
  MinimalFormatter::AppendUint64
            ((MinimalFormatter *)local_140,(long)(siginfo->_sifields)._pad[0],10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,"; ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_140,"stack trace: ***\n");
  puVar1 = (anonymous_namespace)::g_failure_writer;
  iVar3 = MinimalFormatter::num_bytes_written((MinimalFormatter *)local_140);
  (*(code *)puVar1)(&formatter.end_,iVar3);
  return;
}

Assistant:

void DumpSignalInfo(int signal_number, siginfo_t *siginfo) {
  // Get the signal name.
  const char* signal_name = NULL;
  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    if (signal_number == kFailureSignals[i].number) {
      signal_name = kFailureSignals[i].name;
    }
  }

  char buf[256];  // Big enough for signal info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString("*** ");
  if (signal_name) {
    formatter.AppendString(signal_name);
  } else {
    // Use the signal number if the name is unknown.  The signal name
    // should be known, but just in case.
    formatter.AppendString("Signal ");
    formatter.AppendUint64(signal_number, 10);
  }
  formatter.AppendString(" (@0x");
  formatter.AppendUint64(reinterpret_cast<uintptr_t>(siginfo->si_addr), 16);
  formatter.AppendString(")");
  formatter.AppendString(" received by PID ");
  formatter.AppendUint64(getpid(), 10);
  formatter.AppendString(" (TID 0x");
  // We assume pthread_t is an integral number or a pointer, rather
  // than a complex struct.  In some environments, pthread_self()
  // returns an uint64 but in some other environments pthread_self()
  // returns a pointer.  Hence we use C-style cast here, rather than
  // reinterpret/static_cast, to support both types of environments.
  formatter.AppendUint64((uintptr_t)pthread_self(), 16);
  formatter.AppendString(") ");
  // Only linux has the PID of the signal sender in si_pid.
#ifdef OS_LINUX
  formatter.AppendString("from PID ");
  formatter.AppendUint64(siginfo->si_pid, 10);
  formatter.AppendString("; ");
#endif
  formatter.AppendString("stack trace: ***\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}